

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O0

short __thiscall gr::GrBufferIStream::ReadShortFromFont(GrBufferIStream *this)

{
  byte bVar1;
  byte bVar2;
  undefined4 *puVar3;
  long in_RDI;
  short snInput;
  
  if ((*(long *)(in_RDI + 0x18) != 0) && (*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) < 2))
  {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0x80000001;
    __cxa_throw(puVar3,&GrResult::typeinfo,0);
  }
  bVar1 = **(byte **)(in_RDI + 0x10);
  bVar2 = *(byte *)(*(long *)(in_RDI + 0x10) + 1);
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 2;
  return (ushort)bVar1 * 0x100 + (ushort)bVar2;
}

Assistant:

short GrBufferIStream::ReadShortFromFont()
{
	short snInput;

    if (m_pbLim && 2 > m_pbLim - m_pbNext)
        THROW(kresReadFault);

    snInput = (m_pbNext[0] << 8) + m_pbNext[1];
	m_pbNext += 2;
	return snInput;
}